

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_history.cpp
# Opt level: O0

void __thiscall undo::UndoHistory::moveTo(UndoHistory *this,UndoState *new_state)

{
  bool bVar1;
  reference ppUVar2;
  value_type local_78;
  UndoState *p;
  stack<const_undo::UndoState_*,_std::deque<const_undo::UndoState_*,_std::allocator<const_undo::UndoState_*>_>_>
  redo_parents;
  UndoState *common;
  UndoState *new_state_local;
  UndoHistory *this_local;
  
  redo_parents.c.
  super__Deque_base<const_undo::UndoState_*,_std::allocator<const_undo::UndoState_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node =
       (_Map_pointer)findCommonParent(this,this->m_cur,new_state);
  if (this->m_cur != (UndoState *)0x0) {
    while (this->m_cur !=
           (UndoState *)
           redo_parents.c.
           super__Deque_base<const_undo::UndoState_*,_std::allocator<const_undo::UndoState_*>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_node) {
      (*this->m_cur->m_cmd->_vptr_UndoCommand[2])();
      this->m_cur = this->m_cur->m_parent;
    }
  }
  if (new_state != (UndoState *)0x0) {
    std::
    stack<undo::UndoState_const*,std::deque<undo::UndoState_const*,std::allocator<undo::UndoState_const*>>>
    ::stack<std::deque<undo::UndoState_const*,std::allocator<undo::UndoState_const*>>,void>
              ((stack<undo::UndoState_const*,std::deque<undo::UndoState_const*,std::allocator<undo::UndoState_const*>>>
                *)&p);
    for (local_78 = new_state;
        local_78 !=
        (value_type)
        redo_parents.c.
        super__Deque_base<const_undo::UndoState_*,_std::allocator<const_undo::UndoState_*>_>._M_impl
        .super__Deque_impl_data._M_finish._M_node; local_78 = local_78->m_parent) {
      std::
      stack<const_undo::UndoState_*,_std::deque<const_undo::UndoState_*,_std::allocator<const_undo::UndoState_*>_>_>
      ::push((stack<const_undo::UndoState_*,_std::deque<const_undo::UndoState_*,_std::allocator<const_undo::UndoState_*>_>_>
              *)&p,&local_78);
    }
    while (bVar1 = std::
                   stack<const_undo::UndoState_*,_std::deque<const_undo::UndoState_*,_std::allocator<const_undo::UndoState_*>_>_>
                   ::empty((stack<const_undo::UndoState_*,_std::deque<const_undo::UndoState_*,_std::allocator<const_undo::UndoState_*>_>_>
                            *)&p), ((bVar1 ^ 0xffU) & 1) != 0) {
      ppUVar2 = std::
                stack<const_undo::UndoState_*,_std::deque<const_undo::UndoState_*,_std::allocator<const_undo::UndoState_*>_>_>
                ::top((stack<const_undo::UndoState_*,_std::deque<const_undo::UndoState_*,_std::allocator<const_undo::UndoState_*>_>_>
                       *)&p);
      local_78 = *ppUVar2;
      std::
      stack<const_undo::UndoState_*,_std::deque<const_undo::UndoState_*,_std::allocator<const_undo::UndoState_*>_>_>
      ::pop((stack<const_undo::UndoState_*,_std::deque<const_undo::UndoState_*,_std::allocator<const_undo::UndoState_*>_>_>
             *)&p);
      (*local_78->m_cmd->_vptr_UndoCommand[3])();
    }
    std::
    stack<const_undo::UndoState_*,_std::deque<const_undo::UndoState_*,_std::allocator<const_undo::UndoState_*>_>_>
    ::~stack((stack<const_undo::UndoState_*,_std::deque<const_undo::UndoState_*,_std::allocator<const_undo::UndoState_*>_>_>
              *)&p);
  }
  this->m_cur = new_state;
  return;
}

Assistant:

void UndoHistory::moveTo(const UndoState* new_state)
{
  const UndoState* common = findCommonParent(m_cur, new_state);

  if (m_cur) {
    while (m_cur != common) {
      m_cur->m_cmd->undo();
      m_cur = m_cur->m_parent;
    }
  }

  if (new_state) {
    std::stack<const UndoState*> redo_parents;
    const UndoState* p = new_state;
    while (p != common) {
      redo_parents.push(p);
      p = p->m_parent;
    }

    while (!redo_parents.empty()) {
      p = redo_parents.top();
      redo_parents.pop();

      p->m_cmd->redo();
    }
  }

  m_cur = const_cast<UndoState*>(new_state);
}